

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status hrgls_APICreateParametersDestroy(hrgls_APICreateParams params)

{
  hrgls_Status s;
  hrgls_APICreateParams params_local;
  
  if (params == (hrgls_APICreateParams)0x0) {
    params_local._4_4_ = 0x3ec;
  }
  else {
    if (params != (hrgls_APICreateParams)0x0) {
      hrgls_APICreateParams_::~hrgls_APICreateParams_(params);
      operator_delete(params);
    }
    params_local._4_4_ = 0;
  }
  return params_local._4_4_;
}

Assistant:

hrgls_Status hrgls_APICreateParametersDestroy(hrgls_APICreateParams params)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_DELETE_OF_NULL_POINTER;
    }
    try {
      delete params;
    } catch (...) {
      s = hrgls_STATUS_DELETION_FAILED;
    }
    return s;
  }